

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_key_share.cc
# Opt level: O1

bool bssl::ssl_name_to_group_id(uint16_t *out_group_id,char *name,size_t len)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *__s;
  bool bVar4;
  
  bVar4 = true;
  __s = "secp224r1";
  lVar3 = 0x1f8;
  while( true ) {
    sVar2 = strlen(__s + -0x20);
    if (((sVar2 == len) && (iVar1 = strncmp(__s + -0x20,name,len), iVar1 == 0)) ||
       ((sVar2 = strlen(__s), sVar2 == len && sVar2 != 0 &&
        (iVar1 = strncmp(__s,name,len), iVar1 == 0)))) break;
    __s = __s + 0x48;
    lVar3 = lVar3 + -0x48;
    bVar4 = lVar3 != 0;
    if (!bVar4) {
      return bVar4;
    }
  }
  *out_group_id = *(uint16_t *)(__s + -0x22);
  return bVar4;
}

Assistant:

bool ssl_name_to_group_id(uint16_t *out_group_id, const char *name,
                          size_t len) {
  for (const auto &group : kNamedGroups) {
    if (len == strlen(group.name) &&  //
        !strncmp(group.name, name, len)) {
      *out_group_id = group.group_id;
      return true;
    }
    if (strlen(group.alias) > 0 && len == strlen(group.alias) &&
        !strncmp(group.alias, name, len)) {
      *out_group_id = group.group_id;
      return true;
    }
  }
  return false;
}